

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISkin.cpp
# Opt level: O0

void __thiscall
irr::gui::CGUISkin::draw3DButtonPanePressed
          (CGUISkin *this,IGUIElement *element,rect<int> *r,rect<int> *clip)

{
  long *plVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  SColor SVar4;
  undefined8 in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RDI;
  SColor c2;
  SColor c1;
  rect<int> rect;
  f32 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  
  if (in_RDI[0x4b] != 0) {
    local_30 = *in_RDX;
    local_28 = in_RDX[1];
    plVar1 = (long *)in_RDI[0x4b];
    local_20 = in_RCX;
    uVar2 = (**(code **)*in_RDI)(in_RDI,3);
    (**(code **)(*plVar1 + 0x198))(plVar1,uVar2,&local_30,local_20);
    local_28 = CONCAT44(local_28._4_4_ + -1,(int)local_28 + -1);
    plVar1 = (long *)in_RDI[0x4b];
    uVar2 = (**(code **)*in_RDI)(in_RDI,0);
    (**(code **)(*plVar1 + 0x198))(plVar1,uVar2,&local_30,local_20);
    local_30._4_4_ = local_30._4_4_ + 1;
    plVar1 = (long *)in_RDI[0x4b];
    local_30._0_4_ = (int)local_30 + 1;
    uVar2 = (**(code **)*in_RDI)(in_RDI,1);
    (**(code **)(*plVar1 + 0x198))(plVar1,uVar2,&local_30,local_20);
    local_30 = CONCAT44(local_30._4_4_ + 1,(int)local_30 + 1);
    if ((*(byte *)(in_RDI + 0x4c) & 1) == 0) {
      plVar1 = (long *)in_RDI[0x4b];
      uVar2 = (**(code **)*in_RDI)(in_RDI,2);
      (**(code **)(*plVar1 + 0x198))(plVar1,uVar2,&local_30,local_20);
    }
    else {
      uVar2 = (**(code **)*in_RDI)(in_RDI,2);
      uVar3 = (**(code **)*in_RDI)(in_RDI,0);
      SVar4 = video::SColor::getInterpolated
                        ((SColor *)CONCAT44(uVar2,in_stack_ffffffffffffffb8),
                         (SColor *)CONCAT44(uVar3,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffac);
      (**(code **)(*(long *)in_RDI[0x4b] + 0x1a0))
                ((long *)in_RDI[0x4b],&local_30,uVar2,uVar2,SVar4.color,SVar4.color,local_20);
    }
  }
  return;
}

Assistant:

void CGUISkin::draw3DButtonPanePressed(IGUIElement *element,
		const core::rect<s32> &r,
		const core::rect<s32> *clip)
{
	if (!Driver)
		return;

	core::rect<s32> rect = r;
	Driver->draw2DRectangle(getColor(EGDC_3D_HIGH_LIGHT), rect, clip);

	rect.LowerRightCorner.X -= 1;
	rect.LowerRightCorner.Y -= 1;
	Driver->draw2DRectangle(getColor(EGDC_3D_DARK_SHADOW), rect, clip);

	rect.UpperLeftCorner.X += 1;
	rect.UpperLeftCorner.Y += 1;
	Driver->draw2DRectangle(getColor(EGDC_3D_SHADOW), rect, clip);

	rect.UpperLeftCorner.X += 1;
	rect.UpperLeftCorner.Y += 1;

	if (!UseGradient) {
		Driver->draw2DRectangle(getColor(EGDC_3D_FACE), rect, clip);
	} else {
		const video::SColor c1 = getColor(EGDC_3D_FACE);
		const video::SColor c2 = c1.getInterpolated(getColor(EGDC_3D_DARK_SHADOW), 0.4f);
		Driver->draw2DRectangle(rect, c1, c1, c2, c2, clip);
	}
}